

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O3

int Abc_NtkSubDagSize_rec(Abc_Obj_t *pObj,Vec_Int_t *vAttrs)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  undefined8 extraout_RDX_00;
  int iVar6;
  int iVar7;
  Abc_Ntk_t *pAVar8;
  int *local_40;
  
  pAVar8 = pObj->pNtk;
  uVar4 = pObj->Id;
  Vec_IntFillExtra(&pAVar8->vTravIds,uVar4 + 1,in_EDX);
  if (-1 < (int)uVar4) {
    local_40 = &pObj->Id;
    iVar7 = 0;
    uVar5 = extraout_RDX;
    while ((int)uVar4 < (pAVar8->vTravIds).nSize) {
      pAVar3 = pObj->pNtk;
      iVar1 = pAVar3->nTravIds;
      iVar6 = 0;
      if ((pAVar8->vTravIds).pArray[uVar4] == iVar1) {
LAB_002a3247:
        return iVar6 + iVar7;
      }
      iVar2 = *local_40;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar2 + 1,(int)uVar5);
      if (((long)iVar2 < 0) || ((pAVar3->vTravIds).nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar2] = iVar1;
      iVar1 = *local_40;
      if (((long)iVar1 < 0) || (vAttrs->nSize <= iVar1)) break;
      if (vAttrs->pArray[iVar1] != 0) goto LAB_002a3247;
      uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
      iVar6 = 1;
      if ((uVar4 == 2) || (uVar4 == 5)) goto LAB_002a3247;
      if ((pObj->vFanins).nSize != 2) {
        __assert_fail("Abc_ObjFaninNum(pObj) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                      ,0x291,"int Abc_NtkSubDagSize_rec(Abc_Obj_t *, Vec_Int_t *)");
      }
      iVar6 = Abc_NtkSubDagSize_rec
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],vAttrs);
      iVar1 = (pObj->vFanins).pArray[1];
      pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[iVar1];
      iVar7 = iVar7 + 1 + iVar6;
      pAVar8 = pObj->pNtk;
      local_40 = &pObj->Id;
      uVar4 = pObj->Id;
      Vec_IntFillExtra(&pAVar8->vTravIds,uVar4 + 1,iVar1);
      uVar5 = extraout_RDX_00;
      if ((int)uVar4 < 0) break;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Abc_NtkSubDagSize_rec( Abc_Obj_t * pObj, Vec_Int_t * vAttrs ) 
{
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return 0;
    Abc_NodeSetTravIdCurrent(pObj);
    if ( Vec_IntEntry( vAttrs, pObj->Id ) )
        return 0;
    if ( Abc_ObjIsCi(pObj) )
        return 1;
    assert( Abc_ObjFaninNum(pObj) == 2 );
    return 1 + Abc_NtkSubDagSize_rec(Abc_ObjFanin0(pObj), vAttrs) +
        Abc_NtkSubDagSize_rec(Abc_ObjFanin1(pObj), vAttrs);
}